

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O1

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddInstruction
          (InstructionBuilder *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *insn)

{
  mapped_type pBVar1;
  mapped_type *ppBVar2;
  iterator local_20;
  
  InstructionList::iterator::InsertBefore
            ((iterator *)&local_20,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&this->insert_before_);
  if ((((this->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) &&
      ((this->preserved_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone)) &&
     (pBVar1 = this->parent_, pBVar1 != (mapped_type)0x0)) {
    ppBVar2 = std::__detail::
              _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->context_->instr_to_block_,&local_20.node_);
    *ppBVar2 = pBVar1;
  }
  if (((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) &&
     ((this->preserved_analyses_ & kAnalysisBegin) != kAnalysisNone)) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((this->context_->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               local_20.node_);
  }
  return local_20.node_;
}

Assistant:

Instruction* AddInstruction(std::unique_ptr<Instruction>&& insn) {
    Instruction* insn_ptr = &*insert_before_.InsertBefore(std::move(insn));
    UpdateInstrToBlockMapping(insn_ptr);
    UpdateDefUseMgr(insn_ptr);
    return insn_ptr;
  }